

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qglobalstatic.h
# Opt level: O3

void __thiscall
QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_nullResult>::Holder
          (Holder<(anonymous_namespace)::Q_QGS_nullResult> *this)

{
  long in_FS_OFFSET;
  QSqlDriver *local_18;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  if ((char)Holder<(anonymous_namespace)::Q_QGS_nullDriver>::guard._q_value.
            super___atomic_base<signed_char>._M_i < -1) {
    local_18 = (QSqlDriver *)0x0;
  }
  else if (QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_nullDriver>>::
           instance()::holder == '\0') {
    QtGlobalStatic::Holder((QtGlobalStatic *)&local_18);
  }
  else {
    local_18 = (QSqlDriver *)
               QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_nullDriver>>::
               instance()::holder;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    QSqlNullResult::QSqlNullResult
              ((QSqlNullResult *)
               QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_nullResult>>::
               instance()::holder,local_18);
    guard._q_value.super___atomic_base<signed_char>._M_i = (Type)(__atomic_base<signed_char>)0xff;
    return;
  }
  __stack_chk_fail();
}

Assistant:

Holder() noexcept(ConstructionIsNoexcept)
    {
        QGS::innerFunction(pointer());
        guard.storeRelaxed(QtGlobalStatic::Initialized);
    }